

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

StorageType __thiscall
tcu::Float<unsigned_int,_5,_6,_15,_2U>::mantissa(Float<unsigned_int,_5,_6,_15,_2U> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->m_value;
  if ((uVar1 & 0x7ff) != 0) {
    uVar2 = uVar1 & 0x3f;
    uVar3 = uVar2;
    if (uVar2 == 0) {
      uVar3 = uVar2 + 0x40;
    }
    if ((uVar1 & 0x7c0) != 0) {
      uVar3 = uVar2 + 0x40;
    }
    return uVar3;
  }
  return 0;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}